

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void hashkey(connectdata *conn,char *buf,size_t len)

{
  int iVar1;
  long local_30;
  long port;
  char *hostname;
  size_t len_local;
  char *buf_local;
  connectdata *conn_local;
  
  iVar1 = conn->remote_port;
  if (((*(uint *)&(conn->bits).field_0x4 & 1) == 0) ||
     ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != 0)) {
    if ((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0) {
      port = (long)(conn->host).name;
    }
    else {
      port = (long)(conn->conn_to_host).name;
    }
  }
  else {
    port = (long)(conn->http_proxy).host.name;
    iVar1 = conn->port;
  }
  local_30 = (long)iVar1;
  curl_msnprintf(buf,len,"%u/%ld/%s",(ulong)conn->scope_id,local_30,port);
  Curl_strntolower(buf,buf,len);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf, size_t len)
{
  const char *hostname;
  long port = conn->remote_port;
  DEBUGASSERT(len >= HASHKEY_SIZE);
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->port;
  }
  else
#endif
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  /* put the numbers first so that the hostname gets cut off if too long */
#ifdef ENABLE_IPV6
  msnprintf(buf, len, "%u/%ld/%s", conn->scope_id, port, hostname);
#else
  msnprintf(buf, len, "%ld/%s", port, hostname);
#endif
  Curl_strntolower(buf, buf, len);
}